

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_targetCBlockSize
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock)

{
  uint uVar1;
  size_t err_code_1;
  size_t err_code;
  size_t bss;
  size_t cSize;
  U32 lastBlock_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *zc_local;
  
  zc_local = (ZSTD_CCtx *)ZSTD_buildSeqStore(zc,src,srcSize);
  uVar1 = ERR_isError((size_t)zc_local);
  if (uVar1 == 0) {
    zc_local = (ZSTD_CCtx *)
               ZSTD_compressBlock_targetCBlockSize_body
                         (zc,dst,dstCapacity,src,srcSize,(size_t)zc_local,lastBlock);
    uVar1 = ERR_isError((size_t)zc_local);
    if ((uVar1 == 0) &&
       ((((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid)) {
      (((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
    }
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_compressBlock_targetCBlockSize(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                               U32 lastBlock)
{
    size_t cSize = 0;
    const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
    DEBUGLOG(5, "ZSTD_compressBlock_targetCBlockSize (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u, srcSize=%zu)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit, (unsigned)zc->blockState.matchState.nextToUpdate, srcSize);
    FORWARD_IF_ERROR(bss);

    cSize = ZSTD_compressBlock_targetCBlockSize_body(zc, dst, dstCapacity, src, srcSize, bss, lastBlock);
    FORWARD_IF_ERROR(cSize);

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}